

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O3

bool __thiscall QFileDevice::flush(QFileDevice *this)

{
  QIODevicePrivate *pQVar1;
  QRingBuffer *pQVar2;
  QRingChunk *pQVar3;
  bool bVar4;
  int iVar5;
  FileError FVar6;
  int extraout_var;
  FileError FVar7;
  char *pcVar8;
  QAbstractFileEngine *this_00;
  void *pvVar9;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  void *__ptr;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).d_ptr._M_t.
           super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
           super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
           super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  this_00 = (QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate;
  if (this_00 != (QAbstractFileEngine *)0x0) {
    pQVar2 = (pQVar1->writeBuffer).m_buf;
    if ((pQVar2 == (QRingBuffer *)0x0) || (pQVar2->bufferSize == 0)) {
LAB_00112824:
      iVar5 = (*this_00->_vptr_QAbstractFileEngine[4])();
      bVar4 = true;
      if ((char)iVar5 != '\0') goto LAB_00112898;
      this_00 = (QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate;
    }
    else {
      pQVar3 = (pQVar2->buffers).d.ptr;
      pcVar8 = (pQVar3->chunk).d.ptr;
      pvVar9 = (void *)(pQVar3->tailOffset - pQVar3->headOffset);
      if (pcVar8 == (char *)0x0) {
        pcVar8 = "";
      }
      iVar5 = (*this_00->_vptr_QAbstractFileEngine[0x25])
                        (this_00,pcVar8 + pQVar3->headOffset,pvVar9);
      __ptr = (void *)CONCAT44(extraout_var,iVar5);
      if (__ptr != (void *)0x0 && -1 < extraout_var) {
        QRingBuffer::free((pQVar1->writeBuffer).m_buf,__ptr);
      }
      this_00 = (QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate;
      if (__ptr == pvVar9) goto LAB_00112824;
    }
    FVar6 = QAbstractFileEngine::error(this_00);
    FVar7 = WriteError;
    if (FVar6 != UnspecifiedError) {
      FVar7 = FVar6;
    }
    QAbstractFileEngine::errorString
              (&local_40,(QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate);
    *(FileError *)((long)&pQVar1[1].devicePos + 4) = FVar7;
    QString::operator=(&pQVar1->errorString,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar4 = false;
LAB_00112898:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDevice::flush()
{
    Q_D(QFileDevice);
    if (!d->fileEngine) {
        qWarning("QFileDevice::flush: No file engine. Is IODevice open?");
        return false;
    }

    if (!d->writeBuffer.isEmpty()) {
        qint64 size = d->writeBuffer.nextDataBlockSize();
        qint64 written = d->fileEngine->write(d->writeBuffer.readPointer(), size);
        if (written > 0)
            d->writeBuffer.free(written);
        if (written != size) {
            QFileDevice::FileError err = d->fileEngine->error();
            if (err == QFileDevice::UnspecifiedError)
                err = QFileDevice::WriteError;
            d->setError(err, d->fileEngine->errorString());
            return false;
        }
    }

    if (!d->fileEngine->flush()) {
        QFileDevice::FileError err = d->fileEngine->error();
        if (err == QFileDevice::UnspecifiedError)
            err = QFileDevice::WriteError;
        d->setError(err, d->fileEngine->errorString());
        return false;
    }
    return true;
}